

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

bool __thiscall
cmCMakePresetsGraphInternal::InListCondition::Evaluate
          (InListCondition *this,MacroExpanderVector *expanders,int version,optional<bool> *out)

{
  bool bVar1;
  __type _Var2;
  ExpandMacroResult EVar3;
  reference pbVar4;
  bool local_9e;
  _Optional_payload_base<bool> local_9d;
  bool local_9b;
  _Optional_payload_base<bool> local_9a;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> item;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_50 [8];
  string str;
  optional<bool> *out_local;
  int version_local;
  MacroExpanderVector *expanders_local;
  InListCondition *this_local;
  
  str.field_2._8_8_ = out;
  std::__cxx11::string::string((string *)local_50,(string *)&this->String);
  EVar3 = ExpandMacros((string *)local_50,expanders,version);
  if (EVar3 != Ok) {
    if (EVar3 == Ignore) {
      std::optional<bool>::reset((optional<bool> *)str.field_2._8_8_);
      this_local._7_1_ = 1;
      goto LAB_00467cdc;
    }
    if (EVar3 == Error) {
      this_local._7_1_ = 0;
      goto LAB_00467cdc;
    }
  }
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->List);
  item.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->List);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&item.field_2 + 8)), bVar1) {
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_98,(string *)pbVar4);
    EVar3 = ExpandMacros((string *)local_98,expanders,version);
    if (EVar3 == Ok) {
LAB_00467c32:
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_98);
      if (_Var2) {
        local_9b = true;
        std::optional<bool>::optional<bool,_true>((optional<bool> *)&local_9a,&local_9b);
        *(_Optional_payload_base<bool> *)str.field_2._8_8_ = local_9a;
        this_local._7_1_ = 1;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    else if (EVar3 == Ignore) {
      std::optional<bool>::reset((optional<bool> *)str.field_2._8_8_);
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    else {
      if (EVar3 != Error) goto LAB_00467c32;
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)local_98);
    if (bVar1) goto LAB_00467cdc;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  local_9e = false;
  std::optional<bool>::optional<bool,_true>((optional<bool> *)&local_9d,&local_9e);
  *(_Optional_payload_base<bool> *)str.field_2._8_8_ = local_9d;
  this_local._7_1_ = 1;
LAB_00467cdc:
  std::__cxx11::string::~string((string *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCMakePresetsGraphInternal::InListCondition::Evaluate(
  MacroExpanderVector const& expanders, int version,
  cm::optional<bool>& out) const
{
  std::string str = this->String;
  CHECK_EXPAND(out, str, expanders, version);

  for (auto item : this->List) {
    CHECK_EXPAND(out, item, expanders, version);
    if (str == item) {
      out = true;
      return true;
    }
  }

  out = false;
  return true;
}